

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::BeginPlay(APlayerPawn *this)

{
  int iVar1;
  int iVar2;
  spritedef_t *psVar3;
  char *pcVar4;
  int wadcrouch;
  int wadnorm;
  FString local_50;
  int local_44;
  int spritecrouch;
  FString local_38;
  int local_30;
  int spritenorm;
  FString local_20;
  FString crouchspritename;
  FString normspritename;
  APlayerPawn *this_local;
  
  AActor::BeginPlay(&this->super_AActor);
  DThinker::ChangeStatNum((DThinker *)this,0x21);
  if (0 < *(int *)&(this->super_AActor).field_0x4bc) {
    psVar3 = TArray<spritedef_t,_spritedef_t>::operator[]
                       (&sprites,(long)((this->super_AActor).SpawnState)->sprite);
    FString::FString(&crouchspritename,(char *)psVar3);
    psVar3 = TArray<spritedef_t,_spritedef_t>::operator[]
                       (&sprites,(long)*(int *)&(this->super_AActor).field_0x4bc);
    FString::FString(&local_20,(char *)psVar3);
    FString::operator+(&local_38,(char *)&crouchspritename);
    pcVar4 = FString::operator_cast_to_char_(&local_38);
    iVar1 = FWadCollection::CheckNumForName(&Wads,pcVar4,1);
    FString::~FString(&local_38);
    local_30 = iVar1;
    if (iVar1 == -1) {
      FString::operator+((FString *)&stack0xffffffffffffffc0,(char *)&crouchspritename);
      pcVar4 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffc0);
      local_30 = FWadCollection::CheckNumForName(&Wads,pcVar4,1);
      FString::~FString((FString *)&stack0xffffffffffffffc0);
    }
    FString::operator+(&local_50,(char *)&local_20);
    pcVar4 = FString::operator_cast_to_char_(&local_50);
    iVar1 = FWadCollection::CheckNumForName(&Wads,pcVar4,1);
    FString::~FString(&local_50);
    local_44 = iVar1;
    if (iVar1 == -1) {
      FString::operator+((FString *)&wadnorm,(char *)&local_20);
      pcVar4 = FString::operator_cast_to_char_((FString *)&wadnorm);
      local_44 = FWadCollection::CheckNumForName(&Wads,pcVar4,1);
      FString::~FString((FString *)&wadnorm);
    }
    if ((local_30 == -1) || (local_44 == -1)) {
      *(undefined4 *)&(this->super_AActor).field_0x4bc = 0;
    }
    else {
      iVar1 = FWadCollection::GetLumpFile(&Wads,local_30);
      iVar2 = FWadCollection::GetLumpFile(&Wads,local_30);
      if ((1 < iVar1) && (iVar2 < 2)) {
        *(undefined4 *)&(this->super_AActor).field_0x4bc = 0;
      }
    }
    FString::~FString(&local_20);
    FString::~FString(&crouchspritename);
  }
  return;
}

Assistant:

void APlayerPawn::BeginPlay ()
{
	Super::BeginPlay ();
	ChangeStatNum (STAT_PLAYER);

	// Check whether a PWADs normal sprite is to be combined with the base WADs
	// crouch sprite. In such a case the sprites normally don't match and it is
	// best to disable the crouch sprite.
	if (crouchsprite > 0)
	{
		// This assumes that player sprites always exist in rotated form and
		// that the front view is always a separate sprite. So far this is
		// true for anything that exists.
		FString normspritename = sprites[SpawnState->sprite].name;
		FString crouchspritename = sprites[crouchsprite].name;

		int spritenorm = Wads.CheckNumForName(normspritename + "A1", ns_sprites);
		if (spritenorm==-1) 
		{
			spritenorm = Wads.CheckNumForName(normspritename + "A0", ns_sprites);
		}

		int spritecrouch = Wads.CheckNumForName(crouchspritename + "A1", ns_sprites);
		if (spritecrouch==-1) 
		{
			spritecrouch = Wads.CheckNumForName(crouchspritename + "A0", ns_sprites);
		}
		
		if (spritenorm==-1 || spritecrouch ==-1) 
		{
			// Sprites do not exist so it is best to disable the crouch sprite.
			crouchsprite = 0;
			return;
		}
	
		int wadnorm = Wads.GetLumpFile(spritenorm);
		int wadcrouch = Wads.GetLumpFile(spritenorm);
		
		if (wadnorm > FWadCollection::IWAD_FILENUM && wadcrouch <= FWadCollection::IWAD_FILENUM) 
		{
			// Question: Add an option / disable crouching or do what?
			crouchsprite = 0;
		}
	}
}